

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddress.cpp
# Opt level: O1

void __thiscall CNetAddr::CNetAddr(CNetAddr *this,in6_addr *ipv6Addr,uint32_t scope)

{
  long lVar1;
  CNetAddr *pCVar2;
  uint uVar3;
  long in_FS_OFFSET;
  Span<const_unsigned_char> ipv6;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->m_addr)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(this->m_addr)._union + 8) = 0;
  (this->m_addr)._size = 0;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::change_capacity(&this->m_addr,0x10);
  uVar3 = (this->m_addr)._size + 0x10;
  (this->m_addr)._size = uVar3;
  pCVar2 = this;
  if (0x10 < uVar3) {
    pCVar2 = (CNetAddr *)(this->m_addr)._union.indirect_contents.indirect;
  }
  (pCVar2->m_addr)._union.indirect_contents.indirect = (char *)0x0;
  *(undefined8 *)((long)&(pCVar2->m_addr)._union + 8) = 0;
  this->m_net = NET_IPV6;
  this->m_scope_id = 0;
  ipv6.m_size = 0x10;
  ipv6.m_data = (uchar *)ipv6Addr;
  SetLegacyIPv6(this,ipv6);
  this->m_scope_id = scope;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CNetAddr::CNetAddr(const struct in6_addr& ipv6Addr, const uint32_t scope)
{
    SetLegacyIPv6({reinterpret_cast<const uint8_t*>(&ipv6Addr), sizeof(ipv6Addr)});
    m_scope_id = scope;
}